

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcoefct.c
# Opt level: O2

int decompress_onepass(j_decompress_ptr cinfo,JSAMPIMAGE output_buf)

{
  _func_void_j_decompress_ptr **pp_Var1;
  JDIMENSION JVar2;
  JDIMENSION JVar3;
  int iVar4;
  jpeg_d_coef_controller *pjVar5;
  jpeg_entropy_decoder *pjVar6;
  jpeg_component_info *pjVar7;
  inverse_DCT_method_ptr p_Var8;
  boolean bVar9;
  int iVar10;
  long lVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  JDIMENSION JVar15;
  int iVar16;
  JSAMPARRAY ppJVar17;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  
  pjVar5 = cinfo->coef;
  JVar2 = cinfo->total_iMCU_rows;
  uVar12 = cinfo->MCUs_per_row - 1;
  iVar18 = *(int *)((long)&pjVar5[1].start_input_pass + 4);
  pp_Var1 = &pjVar5[1].start_output_pass;
  do {
    if (*(int *)&pjVar5[1].consume_data <= iVar18) {
      cinfo->output_iMCU_row = cinfo->output_iMCU_row + 1;
      uVar12 = cinfo->input_iMCU_row + 1;
      cinfo->input_iMCU_row = uVar12;
      if (uVar12 < cinfo->total_iMCU_rows) {
        start_iMCU_row(cinfo);
        iVar18 = 3;
      }
      else {
        (*cinfo->inputctl->finish_input_pass)(cinfo);
        iVar18 = 4;
      }
      return iVar18;
    }
    for (uVar14 = *(uint *)&pjVar5[1].start_input_pass; uVar14 <= uVar12; uVar14 = uVar14 + 1) {
      jzero_far(*pp_Var1,(long)cinfo->blocks_in_MCU << 7);
      pjVar6 = cinfo->entropy;
      if (pjVar6->insufficient_data == 0) {
        cinfo->master->last_good_iMCU_row = cinfo->input_iMCU_row;
      }
      bVar9 = (*pjVar6->decode_mcu)(cinfo,(JBLOCKROW *)pp_Var1);
      if (bVar9 == 0) {
        *(int *)((long)&pjVar5[1].start_input_pass + 4) = iVar18;
        *(uint *)&pjVar5[1].start_input_pass = uVar14;
        return 0;
      }
      if ((cinfo->master->first_iMCU_col <= uVar14) && (uVar14 <= cinfo->master->last_iMCU_col)) {
        iVar16 = 0;
        for (lVar11 = 0; lVar11 < cinfo->comps_in_scan; lVar11 = lVar11 + 1) {
          pjVar7 = cinfo->cur_comp_info[lVar11];
          if (pjVar7->component_needed == 0) {
            iVar16 = iVar16 + pjVar7->MCU_blocks;
          }
          else {
            p_Var8 = cinfo->idct->inverse_DCT[pjVar7->component_index];
            iVar10 = pjVar7->DCT_scaled_size;
            ppJVar17 = output_buf[pjVar7->component_index] + iVar10 * iVar18;
            JVar3 = cinfo->master->first_iMCU_col;
            iVar4 = pjVar7->MCU_sample_width;
            uVar19 = 0;
            uVar20 = (ulong)(uint)(&pjVar7->MCU_width)[(ulong)(uVar12 <= uVar14) * 4];
            if ((&pjVar7->MCU_width)[(ulong)(uVar12 <= uVar14) * 4] < 1) {
              uVar20 = uVar19;
            }
            while (iVar13 = (int)uVar19, iVar13 < pjVar7->MCU_height) {
              if ((cinfo->input_iMCU_row < JVar2 - 1) || (iVar18 + iVar13 < pjVar7->last_row_height)
                 ) {
                JVar15 = (uVar14 - JVar3) * iVar4;
                for (uVar19 = 0; uVar20 != uVar19; uVar19 = uVar19 + 1) {
                  (*p_Var8)(cinfo,pjVar7,(JCOEFPTR)pp_Var1[(long)iVar16 + uVar19],ppJVar17,JVar15);
                  iVar10 = pjVar7->DCT_scaled_size;
                  JVar15 = JVar15 + iVar10;
                }
              }
              iVar16 = iVar16 + pjVar7->MCU_width;
              ppJVar17 = ppJVar17 + iVar10;
              uVar19 = (ulong)(iVar13 + 1);
            }
          }
        }
      }
    }
    *(undefined4 *)&pjVar5[1].start_input_pass = 0;
    iVar18 = iVar18 + 1;
  } while( true );
}

Assistant:

METHODDEF(int)
decompress_onepass(j_decompress_ptr cinfo, JSAMPIMAGE output_buf)
{
  my_coef_ptr coef = (my_coef_ptr)cinfo->coef;
  JDIMENSION MCU_col_num;       /* index of current MCU within row */
  JDIMENSION last_MCU_col = cinfo->MCUs_per_row - 1;
  JDIMENSION last_iMCU_row = cinfo->total_iMCU_rows - 1;
  int blkn, ci, xindex, yindex, yoffset, useful_width;
  JSAMPARRAY output_ptr;
  JDIMENSION start_col, output_col;
  jpeg_component_info *compptr;
  inverse_DCT_method_ptr inverse_DCT;

  /* Loop to process as much as one whole iMCU row */
  for (yoffset = coef->MCU_vert_offset; yoffset < coef->MCU_rows_per_iMCU_row;
       yoffset++) {
    for (MCU_col_num = coef->MCU_ctr; MCU_col_num <= last_MCU_col;
         MCU_col_num++) {
      /* Try to fetch an MCU.  Entropy decoder expects buffer to be zeroed. */
      jzero_far((void *)coef->MCU_buffer[0],
                (size_t)(cinfo->blocks_in_MCU * sizeof(JBLOCK)));
      if (!cinfo->entropy->insufficient_data)
        cinfo->master->last_good_iMCU_row = cinfo->input_iMCU_row;
      if (!(*cinfo->entropy->decode_mcu) (cinfo, coef->MCU_buffer)) {
        /* Suspension forced; update state counters and exit */
        coef->MCU_vert_offset = yoffset;
        coef->MCU_ctr = MCU_col_num;
        return JPEG_SUSPENDED;
      }

      /* Only perform the IDCT on blocks that are contained within the desired
       * cropping region.
       */
      if (MCU_col_num >= cinfo->master->first_iMCU_col &&
          MCU_col_num <= cinfo->master->last_iMCU_col) {
        /* Determine where data should go in output_buf and do the IDCT thing.
         * We skip dummy blocks at the right and bottom edges (but blkn gets
         * incremented past them!).  Note the inner loop relies on having
         * allocated the MCU_buffer[] blocks sequentially.
         */
        blkn = 0;               /* index of current DCT block within MCU */
        for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
          compptr = cinfo->cur_comp_info[ci];
          /* Don't bother to IDCT an uninteresting component. */
          if (!compptr->component_needed) {
            blkn += compptr->MCU_blocks;
            continue;
          }
          inverse_DCT = cinfo->idct->inverse_DCT[compptr->component_index];
          useful_width = (MCU_col_num < last_MCU_col) ?
                         compptr->MCU_width : compptr->last_col_width;
          output_ptr = output_buf[compptr->component_index] +
                       yoffset * compptr->_DCT_scaled_size;
          start_col = (MCU_col_num - cinfo->master->first_iMCU_col) *
                      compptr->MCU_sample_width;
          for (yindex = 0; yindex < compptr->MCU_height; yindex++) {
            if (cinfo->input_iMCU_row < last_iMCU_row ||
                yoffset + yindex < compptr->last_row_height) {
              output_col = start_col;
              for (xindex = 0; xindex < useful_width; xindex++) {
                (*inverse_DCT) (cinfo, compptr,
                                (JCOEFPTR)coef->MCU_buffer[blkn + xindex],
                                output_ptr, output_col);
                output_col += compptr->_DCT_scaled_size;
              }
            }
            blkn += compptr->MCU_width;
            output_ptr += compptr->_DCT_scaled_size;
          }
        }
      }
    }
    /* Completed an MCU row, but perhaps not an iMCU row */
    coef->MCU_ctr = 0;
  }
  /* Completed the iMCU row, advance counters for next one */
  cinfo->output_iMCU_row++;
  if (++(cinfo->input_iMCU_row) < cinfo->total_iMCU_rows) {
    start_iMCU_row(cinfo);
    return JPEG_ROW_COMPLETED;
  }
  /* Completed the scan */
  (*cinfo->inputctl->finish_input_pass) (cinfo);
  return JPEG_SCAN_COMPLETED;
}